

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void delete_edge(edge_t_conflict e)

{
  bb_t pbVar1;
  out_edge_t peVar2;
  in_edge_t peVar3;
  bb_t_conflict bb;
  out_edge_t peVar4;
  DLIST_LINK_out_edge_t *pDVar5;
  in_edge_t peVar6;
  DLIST_LINK_in_edge_t *pDVar7;
  size_t *rpost;
  size_t *in_RSI;
  
  pbVar1 = e->src;
  peVar2 = (e->out_link).prev;
  if (peVar2 != (out_edge_t)0x0) {
    peVar4 = (e->out_link).next;
    (peVar2->out_link).next = peVar4;
LAB_0015fb9d:
    if (peVar4 == (out_edge_t)0x0) {
      if ((pbVar1->out_edges).tail != e) goto LAB_0015fc0f;
      pDVar5 = (DLIST_LINK_out_edge_t *)&(pbVar1->out_edges).tail;
    }
    else {
      pDVar5 = &peVar4->out_link;
    }
    pDVar5->prev = peVar2;
    (e->out_link).prev = (out_edge_t)0x0;
    (e->out_link).next = (out_edge_t)0x0;
    pbVar1 = e->dst;
    peVar3 = (e->in_link).prev;
    if (peVar3 == (in_edge_t)0x0) {
      if ((pbVar1->in_edges).head != e) goto LAB_0015fc14;
      peVar6 = (e->in_link).next;
      (pbVar1->in_edges).head = peVar6;
    }
    else {
      peVar6 = (e->in_link).next;
      (peVar3->in_link).next = peVar6;
    }
    if (peVar6 == (in_edge_t_conflict)0x0) {
      if ((pbVar1->in_edges).tail != e) goto LAB_0015fc19;
      pDVar7 = (DLIST_LINK_in_edge_t *)&(pbVar1->in_edges).tail;
    }
    else {
      pDVar7 = &peVar6->in_link;
    }
    pDVar7->prev = peVar3;
    free(e);
    return;
  }
  if ((pbVar1->out_edges).head == e) {
    peVar4 = (e->out_link).next;
    (pbVar1->out_edges).head = peVar4;
    goto LAB_0015fb9d;
  }
  delete_edge_cold_1();
LAB_0015fc0f:
  delete_edge_cold_2();
LAB_0015fc14:
  delete_edge_cold_3();
LAB_0015fc19:
  delete_edge_cold_4();
  pbVar1 = (bb_t)*in_RSI;
  *in_RSI = (size_t)((long)&pbVar1->index + 1);
  e->dst = pbVar1;
  for (pbVar1 = e[1].dst; pbVar1 != (bb_t)0x0; pbVar1 = (pbVar1->bb_link).next) {
    bb = (bb_t_conflict)pbVar1->pre;
    if (bb->pre == 0) {
      DFS(bb,in_RSI,rpost);
    }
    else if (bb->rpost == 0) {
      *(undefined1 *)((long)&(pbVar1->in_edges).head + 1) = 1;
    }
  }
  peVar3 = (in_edge_t)*rpost;
  *rpost = (size_t)&peVar3[-1].field_0x37;
  (e->in_link).prev = peVar3;
  return;
}

Assistant:

static void delete_edge (edge_t e) {
  DLIST_REMOVE (out_edge_t, e->src->out_edges, e);
  DLIST_REMOVE (in_edge_t, e->dst->in_edges, e);
  free (e);
}